

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O2

void __thiscall
Assimp::ASEImporter::BuildAnimations
          (ASEImporter *this,
          vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *nodes)

{
  undefined8 *puVar1;
  double *pdVar2;
  float fVar3;
  pointer paVar4;
  _IEEESingle temp;
  Logger *pLVar5;
  aiAnimation **ppaVar6;
  aiAnimation *this_00;
  aiNodeAnim **ppaVar7;
  aiNodeAnim *paVar8;
  ulong uVar9;
  aiVectorKey *paVar10;
  aiQuatKey *paVar11;
  aiQuaterniont<float> *paVar12;
  BaseNode *pBVar13;
  long lVar14;
  aiQuatKey *paVar15;
  uint uVar16;
  ulong uVar17;
  pointer ppBVar18;
  ulong uVar19;
  undefined8 uVar20;
  aiQuaterniont<float> aVar21;
  aiQuatKey q;
  aiQuaterniont<float> local_48;
  pointer local_38;
  
  uVar16 = 0;
  for (ppBVar18 = (nodes->
                  super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      ppBVar18 !=
      (nodes->super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>)
      ._M_impl.super__Vector_impl_data._M_finish; ppBVar18 = ppBVar18 + 1) {
    pBVar13 = *ppBVar18;
    if ((pBVar13->mAnim).mPositionType != TRACK) {
      pLVar5 = DefaultLogger::get();
      Logger::warn(pLVar5,"ASE: Position controller uses Bezier/TCB keys. This is not supported.");
      pBVar13 = *ppBVar18;
    }
    if ((pBVar13->mAnim).mRotationType != TRACK) {
      pLVar5 = DefaultLogger::get();
      Logger::warn(pLVar5,"ASE: Rotation controller uses Bezier/TCB keys. This is not supported.");
      pBVar13 = *ppBVar18;
    }
    if ((pBVar13->mAnim).mScalingType != TRACK) {
      pLVar5 = DefaultLogger::get();
      Logger::warn(pLVar5,"ASE: Position controller uses Bezier/TCB keys. This is not supported.");
      pBVar13 = *ppBVar18;
    }
    if (((1 < (ulong)(((long)(pBVar13->mAnim).akeyPositions.
                             super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(pBVar13->mAnim).akeyPositions.
                            super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                            super__Vector_impl_data._M_start) / 0x18)) ||
        (1 < (ulong)(((long)(pBVar13->mAnim).akeyRotations.
                            super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(pBVar13->mAnim).akeyRotations.
                           super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                           super__Vector_impl_data._M_start) / 0x18))) ||
       (1 < (ulong)(((long)(pBVar13->mAnim).akeyScaling.
                           super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(pBVar13->mAnim).akeyScaling.
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x18))) {
      uVar16 = uVar16 + 1;
    }
    if (1 < (ulong)(((long)(pBVar13->mTargetAnim).akeyPositions.
                           super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(pBVar13->mTargetAnim).akeyPositions.
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x18)) {
      fVar3 = (pBVar13->mTargetPosition).x;
      uVar16 = uVar16 + (((uint)fVar3 & 0x7fffff) == 0 || (~(uint)fVar3 & 0x7f800000) != 0);
    }
  }
  if (uVar16 != 0) {
    this->pcScene->mNumAnimations = 1;
    ppaVar6 = (aiAnimation **)operator_new__(8);
    this->pcScene->mAnimations = ppaVar6;
    this_00 = (aiAnimation *)operator_new(0x448);
    aiAnimation::aiAnimation(this_00);
    *this->pcScene->mAnimations = this_00;
    this_00->mNumChannels = uVar16;
    ppaVar7 = (aiNodeAnim **)operator_new__((ulong)uVar16 << 3);
    this_00->mChannels = ppaVar7;
    this_00->mTicksPerSecond = (double)(this->mParser->iTicksPerFrame * this->mParser->iFrameSpeed);
    uVar17 = 0;
    for (local_38 = (nodes->
                    super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        local_38 !=
        (nodes->
        super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>).
        _M_impl.super__Vector_impl_data._M_finish; local_38 = local_38 + 1) {
      pBVar13 = *local_38;
      if ((1 < (ulong)(((long)(pBVar13->mTargetAnim).akeyPositions.
                              super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(pBVar13->mTargetAnim).akeyPositions.
                             super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                             super__Vector_impl_data._M_start) / 0x18)) &&
         (fVar3 = (pBVar13->mTargetPosition).x,
         (~(uint)fVar3 & 0x7f800000) != 0 || ((uint)fVar3 & 0x7fffff) == 0)) {
        paVar8 = (aiNodeAnim *)operator_new(0x438);
        (paVar8->mNodeName).length = 0;
        (paVar8->mNodeName).data[0] = '\0';
        memset((paVar8->mNodeName).data + 1,0x1b,0x3ff);
        paVar8->mRotationKeys = (aiQuatKey *)0x0;
        paVar8->mNumScalingKeys = 0;
        *(undefined8 *)&paVar8->mNumPositionKeys = 0;
        *(undefined8 *)((long)&paVar8->mPositionKeys + 4) = 0;
        paVar8->mScalingKeys = (aiVectorKey *)0x0;
        paVar8->mPreState = aiAnimBehaviour_DEFAULT;
        paVar8->mPostState = aiAnimBehaviour_DEFAULT;
        this_00->mChannels[uVar17] = paVar8;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&q,
                       &pBVar13->mName,".Target");
        uVar20 = q.mValue._0_8_;
        if ((ulong)q.mValue._0_8_ < 0x400) {
          (paVar8->mNodeName).length = (ai_uint32)q.mValue.w;
          memcpy((paVar8->mNodeName).data,(void *)q.mTime,q.mValue._0_8_);
          (paVar8->mNodeName).data[uVar20] = '\0';
        }
        std::__cxx11::string::~string((string *)&q);
        uVar9 = ((long)(pBVar13->mTargetAnim).akeyPositions.
                       super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(pBVar13->mTargetAnim).akeyPositions.
                      super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x18;
        paVar8->mNumPositionKeys = (uint)uVar9;
        uVar9 = uVar9 & 0xffffffff;
        uVar19 = uVar9 * 0x18;
        paVar10 = (aiVectorKey *)operator_new__(uVar19);
        if (uVar9 != 0) {
          lVar14 = 0;
          do {
            *(undefined4 *)((long)&(paVar10->mValue).z + lVar14) = 0;
            puVar1 = (undefined8 *)((long)&paVar10->mTime + lVar14);
            *puVar1 = 0;
            puVar1[1] = 0;
            lVar14 = lVar14 + 0x18;
          } while (uVar19 - lVar14 != 0);
        }
        uVar17 = (ulong)((int)uVar17 + 1);
        paVar8->mPositionKeys = paVar10;
        memcpy(paVar10,(pBVar13->mTargetAnim).akeyPositions.
                       super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                       super__Vector_impl_data._M_start,uVar19);
      }
      if (((1 < (ulong)(((long)(pBVar13->mAnim).akeyPositions.
                               super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                        (long)(pBVar13->mAnim).akeyPositions.
                              super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                              super__Vector_impl_data._M_start) / 0x18)) ||
          (1 < (ulong)(((long)(pBVar13->mAnim).akeyRotations.
                              super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(pBVar13->mAnim).akeyRotations.
                             super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                             super__Vector_impl_data._M_start) / 0x18))) ||
         (1 < (ulong)(((long)(pBVar13->mAnim).akeyScaling.
                             super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(pBVar13->mAnim).akeyScaling.
                            super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                            super__Vector_impl_data._M_start) / 0x18))) {
        paVar8 = (aiNodeAnim *)operator_new(0x438);
        (paVar8->mNodeName).length = 0;
        (paVar8->mNodeName).data[0] = '\0';
        memset((paVar8->mNodeName).data + 1,0x1b,0x3ff);
        paVar8->mRotationKeys = (aiQuatKey *)0x0;
        paVar8->mNumScalingKeys = 0;
        *(undefined8 *)&paVar8->mNumPositionKeys = 0;
        *(undefined8 *)((long)&paVar8->mPositionKeys + 4) = 0;
        paVar8->mScalingKeys = (aiVectorKey *)0x0;
        paVar8->mPreState = aiAnimBehaviour_DEFAULT;
        paVar8->mPostState = aiAnimBehaviour_DEFAULT;
        this_00->mChannels[uVar17] = paVar8;
        uVar9 = (pBVar13->mName)._M_string_length;
        if (uVar9 < 0x400) {
          (paVar8->mNodeName).length = (ai_uint32)uVar9;
          memcpy((paVar8->mNodeName).data,(pBVar13->mName)._M_dataplus._M_p,uVar9);
          (paVar8->mNodeName).data[uVar9] = '\0';
        }
        uVar9 = ((long)(pBVar13->mAnim).akeyPositions.
                       super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(pBVar13->mAnim).akeyPositions.
                      super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x18;
        if (1 < uVar9) {
          paVar8->mNumPositionKeys = (uint)uVar9;
          uVar19 = (uVar9 & 0xffffffff) * 0x18;
          paVar10 = (aiVectorKey *)operator_new__(uVar19);
          if ((uVar9 & 0xffffffff) != 0) {
            lVar14 = 0;
            do {
              *(undefined4 *)((long)&(paVar10->mValue).z + lVar14) = 0;
              puVar1 = (undefined8 *)((long)&paVar10->mTime + lVar14);
              *puVar1 = 0;
              puVar1[1] = 0;
              lVar14 = lVar14 + 0x18;
            } while (uVar19 - lVar14 != 0);
          }
          paVar8->mPositionKeys = paVar10;
          memcpy(paVar10,(pBVar13->mAnim).akeyPositions.
                         super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                         super__Vector_impl_data._M_start,uVar19);
        }
        uVar9 = ((long)(pBVar13->mAnim).akeyRotations.
                       super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(pBVar13->mAnim).akeyRotations.
                      super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x18;
        if (1 < uVar9) {
          paVar8->mNumRotationKeys = (uint)uVar9;
          uVar19 = uVar9 & 0xffffffff;
          paVar11 = (aiQuatKey *)operator_new__(uVar19 * 0x18);
          if (uVar19 != 0) {
            paVar15 = paVar11;
            do {
              paVar15->mTime = 0.0;
              (paVar15->mValue).w = 1.0;
              (paVar15->mValue).x = 0.0;
              (paVar15->mValue).y = 0.0;
              (paVar15->mValue).z = 0.0;
              paVar15 = paVar15 + 1;
            } while (paVar15 != paVar11 + uVar19);
          }
          paVar8->mRotationKeys = paVar11;
          local_48.w = 1.0;
          local_48.x = 0.0;
          local_48.y = 0.0;
          local_48.z = 0.0;
          lVar14 = 0;
          for (uVar19 = 0; uVar19 < (uVar9 & 0xffffffff); uVar19 = uVar19 + 1) {
            paVar4 = (pBVar13->mAnim).akeyRotations.
                     super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar20 = *(undefined8 *)((long)&(paVar4->mValue).y + lVar14);
            pdVar2 = (double *)((long)&paVar4->mTime + lVar14);
            q.mTime = *pdVar2;
            q.mValue._0_8_ = pdVar2[1];
            q.mValue._8_8_ = uVar20;
            if (0x6e < this->mParser->iFileFormat) {
              if (lVar14 == 0) {
                local_48.w = (float)q.mValue._0_8_;
                local_48.x = (float)((ulong)q.mValue._0_8_ >> 0x20);
              }
              else {
                aVar21 = aiQuaterniont<float>::operator*(&local_48,&q.mValue);
                uVar20 = aVar21._8_8_;
                local_48.w = aVar21.w;
                local_48.x = aVar21.x;
              }
              local_48._8_8_ = uVar20;
              paVar12 = aiQuaterniont<float>::Normalize(&local_48);
              q.mValue.w = paVar12->w;
              q.mValue.x = paVar12->x;
              q.mValue.y = paVar12->y;
              q.mValue.z = paVar12->z;
            }
            paVar11 = paVar8->mRotationKeys;
            *(undefined8 *)((long)&(paVar11->mValue).y + lVar14) = q.mValue._8_8_;
            pdVar2 = (double *)((long)&paVar11->mTime + lVar14);
            *pdVar2 = q.mTime;
            pdVar2[1] = (double)q.mValue._0_8_;
            *(uint *)((long)&(paVar8->mRotationKeys->mValue).w + lVar14) =
                 *(uint *)((long)&(paVar8->mRotationKeys->mValue).w + lVar14) ^ 0x80000000;
            uVar9 = (ulong)paVar8->mNumRotationKeys;
            lVar14 = lVar14 + 0x18;
          }
        }
        uVar17 = (ulong)((int)uVar17 + 1);
        uVar9 = ((long)(pBVar13->mAnim).akeyScaling.
                       super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(pBVar13->mAnim).akeyScaling.
                      super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x18;
        if (1 < uVar9) {
          paVar8->mNumScalingKeys = (uint)uVar9;
          uVar19 = (uVar9 & 0xffffffff) * 0x18;
          paVar10 = (aiVectorKey *)operator_new__(uVar19);
          if ((uVar9 & 0xffffffff) != 0) {
            lVar14 = 0;
            do {
              *(undefined4 *)((long)&(paVar10->mValue).z + lVar14) = 0;
              puVar1 = (undefined8 *)((long)&paVar10->mTime + lVar14);
              *puVar1 = 0;
              puVar1[1] = 0;
              lVar14 = lVar14 + 0x18;
            } while (uVar19 - lVar14 != 0);
          }
          paVar8->mScalingKeys = paVar10;
          memcpy(paVar10,(pBVar13->mAnim).akeyScaling.
                         super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                         super__Vector_impl_data._M_start,uVar19);
        }
      }
    }
  }
  return;
}

Assistant:

void ASEImporter::BuildAnimations(const std::vector<BaseNode*>& nodes)
{
    // check whether we have at least one mesh which has animations
    std::vector<ASE::BaseNode*>::const_iterator i =  nodes.begin();
    unsigned int iNum = 0;
    for (;i != nodes.end();++i) {

        // TODO: Implement Bezier & TCB support
        if ((*i)->mAnim.mPositionType != ASE::Animation::TRACK) {
            ASSIMP_LOG_WARN("ASE: Position controller uses Bezier/TCB keys. "
                "This is not supported.");
        }
        if ((*i)->mAnim.mRotationType != ASE::Animation::TRACK) {
            ASSIMP_LOG_WARN("ASE: Rotation controller uses Bezier/TCB keys. "
                "This is not supported.");
        }
        if ((*i)->mAnim.mScalingType != ASE::Animation::TRACK)  {
            ASSIMP_LOG_WARN("ASE: Position controller uses Bezier/TCB keys. "
                "This is not supported.");
        }

        // We compare against 1 here - firstly one key is not
        // really an animation and secondly MAX writes dummies
        // that represent the node transformation.
        if ((*i)->mAnim.akeyPositions.size()>1 || (*i)->mAnim.akeyRotations.size()>1 || (*i)->mAnim.akeyScaling.size()>1){
            ++iNum;
        }
        if ((*i)->mTargetAnim.akeyPositions.size() > 1 && is_not_qnan( (*i)->mTargetPosition.x )) {
            ++iNum;
        }
    }
    if (iNum)   {
        // Generate a new animation channel and setup everything for it
        pcScene->mNumAnimations = 1;
        pcScene->mAnimations    = new aiAnimation*[1];
        aiAnimation* pcAnim     = pcScene->mAnimations[0] = new aiAnimation();
        pcAnim->mNumChannels    = iNum;
        pcAnim->mChannels       = new aiNodeAnim*[iNum];
        pcAnim->mTicksPerSecond = mParser->iFrameSpeed * mParser->iTicksPerFrame;

        iNum = 0;

        // Now iterate through all meshes and collect all data we can find
        for (i =  nodes.begin();i != nodes.end();++i)   {

            ASE::BaseNode* me = *i;
            if ( me->mTargetAnim.akeyPositions.size() > 1 && is_not_qnan( me->mTargetPosition.x ))  {
                // Generate an extra channel for the camera/light target.
                // BuildNodes() does also generate an extra node, named
                // <baseName>.Target.
                aiNodeAnim* nd = pcAnim->mChannels[iNum++] = new aiNodeAnim();
                nd->mNodeName.Set(me->mName + ".Target");

                // If there is no input position channel we will need
                // to supply the default position from the node's
                // local transformation matrix.
                /*TargetAnimationHelper helper;
                if (me->mAnim.akeyPositions.empty())
                {
                    aiMatrix4x4& mat = (*i)->mTransform;
                    helper.SetFixedMainAnimationChannel(aiVector3D(
                        mat.a4, mat.b4, mat.c4));
                }
                else helper.SetMainAnimationChannel (&me->mAnim.akeyPositions);
                helper.SetTargetAnimationChannel (&me->mTargetAnim.akeyPositions);

                helper.Process(&me->mTargetAnim.akeyPositions);*/

                // Allocate the key array and fill it
                nd->mNumPositionKeys = (unsigned int) me->mTargetAnim.akeyPositions.size();
                nd->mPositionKeys = new aiVectorKey[nd->mNumPositionKeys];

                ::memcpy(nd->mPositionKeys,&me->mTargetAnim.akeyPositions[0],
                    nd->mNumPositionKeys * sizeof(aiVectorKey));
            }

            if (me->mAnim.akeyPositions.size() > 1 || me->mAnim.akeyRotations.size() > 1 || me->mAnim.akeyScaling.size() > 1)   {
                // Begin a new node animation channel for this node
                aiNodeAnim* nd = pcAnim->mChannels[iNum++] = new aiNodeAnim();
                nd->mNodeName.Set(me->mName);

                // copy position keys
                if (me->mAnim.akeyPositions.size() > 1 )
                {
                    // Allocate the key array and fill it
                    nd->mNumPositionKeys = (unsigned int) me->mAnim.akeyPositions.size();
                    nd->mPositionKeys = new aiVectorKey[nd->mNumPositionKeys];

                    ::memcpy(nd->mPositionKeys,&me->mAnim.akeyPositions[0],
                        nd->mNumPositionKeys * sizeof(aiVectorKey));
                }
                // copy rotation keys
                if (me->mAnim.akeyRotations.size() > 1 )    {
                    // Allocate the key array and fill it
                    nd->mNumRotationKeys = (unsigned int) me->mAnim.akeyRotations.size();
                    nd->mRotationKeys = new aiQuatKey[nd->mNumRotationKeys];

                    // --------------------------------------------------------------------
                    // Rotation keys are offsets to the previous keys.
                    // We have the quaternion representations of all
                    // of them, so we just need to concatenate all
                    // (unit-length) quaternions to get the absolute
                    // rotations.
                    // Rotation keys are ABSOLUTE for older files
                    // --------------------------------------------------------------------

                    aiQuaternion cur;
                    for (unsigned int a = 0; a < nd->mNumRotationKeys;++a)  {
                        aiQuatKey q = me->mAnim.akeyRotations[a];

                        if (mParser->iFileFormat > 110) {
                            cur = (a ? cur*q.mValue : q.mValue);
                            q.mValue = cur.Normalize();
                        }
                        nd->mRotationKeys[a] = q;

                        // need this to get to Assimp quaternion conventions
                        nd->mRotationKeys[a].mValue.w *= -1.f;
                    }
                }
                // copy scaling keys
                if (me->mAnim.akeyScaling.size() > 1 )  {
                    // Allocate the key array and fill it
                    nd->mNumScalingKeys = (unsigned int) me->mAnim.akeyScaling.size();
                    nd->mScalingKeys = new aiVectorKey[nd->mNumScalingKeys];

                    ::memcpy(nd->mScalingKeys,&me->mAnim.akeyScaling[0],
                        nd->mNumScalingKeys * sizeof(aiVectorKey));
                }
            }
        }
    }
}